

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_right.cpp
# Opt level: O1

void duckdb::LeftFunction<duckdb::LeftRightGrapheme>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  VectorType VVar2;
  VectorType VVar3;
  unsigned_long *puVar4;
  anon_union_16_2_67f50693_for_value *paVar5;
  Vector *pVVar6;
  data_ptr_t pdVar7;
  idx_t count;
  long *plVar8;
  data_ptr_t pdVar9;
  sel_t *psVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  byte bVar12;
  undefined1 auVar13 [8];
  reference vector;
  reference vector_00;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  idx_t iVar18;
  TemplatedValidityData<unsigned_long> *pTVar19;
  ulong uVar20;
  ulong uVar21;
  idx_t iVar22;
  ulong uVar23;
  ulong uVar24;
  idx_t idx_in_entry;
  long lVar25;
  data_ptr_t pdVar26;
  data_ptr_t pdVar27;
  data_ptr_t pdVar28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var29;
  size_t sVar30;
  long lVar31;
  int64_t in_R9;
  idx_t iVar32;
  string_t sVar33;
  anon_struct_16_3_d7536bce_for_pointer aVar34;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  string_t input_04;
  string_t input_05;
  string_t input_06;
  string_t input_07;
  string_t input_08;
  string_t input_09;
  UnifiedVectorFormat ldata;
  undefined1 local_e8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  ValidityMask *local_d8;
  UnifiedVectorFormat local_d0;
  ulong local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  VVar2 = vector->vector_type;
  VVar3 = vector_00->vector_type;
  if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    paVar5 = (anon_union_16_2_67f50693_for_value *)result->data;
    if (((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) &&
       ((puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar4 == (unsigned_long *)0x0 || ((*puVar4 & 1) != 0)))) {
      pVVar6 = *(Vector **)vector->data;
      pdVar7 = *(data_ptr_t *)(vector->data + 8);
      lVar17 = *(long *)vector_00->data;
      lVar31 = lVar17;
      if (lVar17 < 0) {
        pdVar26 = pdVar7;
        if (((ulong)pVVar6 & 0xffffffff) < 0xd) {
          pdVar26 = (data_ptr_t)((long)&local_d0.sel + 4);
        }
        local_d0.sel = (SelectionVector *)pVVar6;
        local_d0.data = pdVar7;
        uVar14 = (ulong)pVVar6 & 0xffffffff;
        if (uVar14 != 0) {
          uVar20 = 0;
          do {
            if ((char)pdVar26[uVar20] < '\0') {
              uVar14 = Utf8Proc::GraphemeCount((char *)pdVar26,uVar14);
              break;
            }
            uVar20 = uVar20 + 1;
          } while (uVar14 != uVar20);
        }
        lVar31 = 0;
        if (0 < (long)(uVar14 + lVar17)) {
          lVar31 = uVar14 + lVar17;
        }
      }
      input_09.value.pointer.ptr = (char *)0x1;
      input_09.value._0_8_ = pdVar7;
      aVar34 = (anon_struct_16_3_d7536bce_for_pointer)
               SubstringGrapheme((duckdb *)result,pVVar6,input_09,lVar31,in_R9);
      paVar5->pointer = aVar34;
      return;
    }
  }
  else {
    count = args->count;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
      pdVar7 = vector->data;
      plVar8 = (long *)vector_00->data;
      puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar26 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          if (count + 0x3f < 0x40) {
            return;
          }
          local_d8 = (ValidityMask *)(count + 0x3f >> 6);
          uVar20 = 0;
          uVar14 = 0;
          do {
            puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar4 == (unsigned_long *)0x0) {
              uVar15 = 0xffffffffffffffff;
            }
            else {
              uVar15 = puVar4[uVar14];
            }
            uVar24 = uVar20 + 0x40;
            if (count <= uVar20 + 0x40) {
              uVar24 = count;
            }
            uVar23 = uVar24;
            if (uVar15 != 0) {
              uVar23 = uVar20;
              if (uVar15 == 0xffffffffffffffff) {
                if (uVar20 < uVar24) {
                  lVar17 = *plVar8;
                  do {
                    lVar25 = uVar20 * 0x10;
                    pVVar6 = *(Vector **)(pdVar7 + lVar25);
                    pdVar9 = *(data_ptr_t *)(pdVar7 + lVar25 + 8);
                    lVar31 = lVar17;
                    if (lVar17 < 0) {
                      pdVar27 = pdVar9;
                      if (((ulong)pVVar6 & 0xffffffff) < 0xd) {
                        pdVar27 = (data_ptr_t)((long)&local_d0.sel + 4);
                      }
                      local_d0.sel = (SelectionVector *)pVVar6;
                      local_d0.data = pdVar9;
                      sVar30 = (ulong)pVVar6 & 0xffffffff;
                      if (sVar30 != 0) {
                        uVar15 = 0;
                        do {
                          if ((char)pdVar27[uVar15] < '\0') {
                            sVar30 = Utf8Proc::GraphemeCount((char *)pdVar27,sVar30);
                            break;
                          }
                          uVar15 = uVar15 + 1;
                        } while (sVar30 != uVar15);
                      }
                      lVar31 = sVar30 + lVar17;
                      if (lVar31 < 1) {
                        lVar31 = 0;
                      }
                    }
                    input.value.pointer.ptr = (char *)0x1;
                    input.value._0_8_ = pdVar9;
                    sVar33 = SubstringGrapheme((duckdb *)result,pVVar6,input,lVar31,in_R9);
                    *(long *)(pdVar26 + lVar25) = sVar33.value._0_8_;
                    *(long *)(pdVar26 + lVar25 + 8) = sVar33.value._8_8_;
                    uVar20 = uVar20 + 1;
                    uVar23 = uVar20;
                  } while (uVar20 != uVar24);
                }
              }
              else if (uVar20 < uVar24) {
                do {
                  if ((uVar15 >> ((ulong)(uint)((int)uVar23 - (int)uVar20) & 0x3f) & 1) != 0) {
                    lVar31 = uVar23 * 0x10;
                    pVVar6 = *(Vector **)(pdVar7 + lVar31);
                    pdVar9 = *(data_ptr_t *)(pdVar7 + lVar31 + 8);
                    lVar17 = *plVar8;
                    if (lVar17 < 0) {
                      pdVar27 = pdVar9;
                      if (((ulong)pVVar6 & 0xffffffff) < 0xd) {
                        pdVar27 = (data_ptr_t)((long)&local_d0.sel + 4);
                      }
                      local_d0.sel = (SelectionVector *)pVVar6;
                      local_d0.data = pdVar9;
                      uVar16 = (ulong)pVVar6 & 0xffffffff;
                      if (uVar16 != 0) {
                        uVar21 = 0;
                        do {
                          if ((char)pdVar27[uVar21] < '\0') {
                            uVar16 = Utf8Proc::GraphemeCount((char *)pdVar27,uVar16);
                            break;
                          }
                          uVar21 = uVar21 + 1;
                        } while (uVar16 != uVar21);
                      }
                      lVar17 = uVar16 + lVar17;
                      if (lVar17 < 1) {
                        lVar17 = 0;
                      }
                    }
                    input_00.value.pointer.ptr = (char *)0x1;
                    input_00.value._0_8_ = pdVar9;
                    sVar33 = SubstringGrapheme((duckdb *)result,pVVar6,input_00,lVar17,in_R9);
                    *(long *)(pdVar26 + lVar31) = sVar33.value._0_8_;
                    *(long *)(pdVar26 + lVar31 + 8) = sVar33.value._8_8_;
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar23 != uVar24);
              }
            }
            uVar20 = uVar23;
            uVar14 = uVar14 + 1;
            if ((ValidityMask *)uVar14 == local_d8) {
              return;
            }
          } while( true );
        }
        if (count == 0) {
          return;
        }
        lVar17 = *plVar8;
        iVar32 = 0;
        do {
          lVar25 = iVar32 * 0x10;
          pVVar6 = *(Vector **)(pdVar7 + lVar25);
          pdVar9 = *(data_ptr_t *)(pdVar7 + lVar25 + 8);
          lVar31 = lVar17;
          if (lVar17 < 0) {
            pdVar27 = pdVar9;
            if (((ulong)pVVar6 & 0xffffffff) < 0xd) {
              pdVar27 = (data_ptr_t)((long)&local_d0.sel + 4);
            }
            local_d0.sel = (SelectionVector *)pVVar6;
            local_d0.data = pdVar9;
            sVar30 = (ulong)pVVar6 & 0xffffffff;
            if (sVar30 != 0) {
              uVar14 = 0;
              do {
                if ((char)pdVar27[uVar14] < '\0') {
                  sVar30 = Utf8Proc::GraphemeCount((char *)pdVar27,sVar30);
                  break;
                }
                uVar14 = uVar14 + 1;
              } while (sVar30 != uVar14);
            }
            lVar31 = sVar30 + lVar17;
            if (lVar31 < 1) {
              lVar31 = 0;
            }
          }
          input_04.value.pointer.ptr = (char *)0x1;
          input_04.value._0_8_ = pdVar9;
          sVar33 = SubstringGrapheme((duckdb *)result,pVVar6,input_04,lVar31,in_R9);
          *(long *)(pdVar26 + lVar25) = sVar33.value._0_8_;
          *(long *)(pdVar26 + lVar25 + 8) = sVar33.value._8_8_;
          iVar32 = iVar32 + 1;
          if (iVar32 == count) {
            return;
          }
        } while( true );
      }
    }
    else {
      if ((VVar2 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar2 == FLAT_VECTOR) {
          pdVar7 = vector->data;
          pdVar26 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar9 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          local_d8 = &result->validity;
          ValidityMask::Combine(&result->validity,&vector_00->validity,count);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              iVar32 = 0;
              do {
                lVar31 = iVar32 * 0x10;
                pVVar6 = *(Vector **)(pdVar7 + lVar31);
                pdVar27 = *(data_ptr_t *)(pdVar7 + lVar31 + 8);
                lVar17 = *(long *)(pdVar26 + iVar32 * 8);
                if (lVar17 < 0) {
                  pdVar28 = pdVar27;
                  if (((ulong)pVVar6 & 0xffffffff) < 0xd) {
                    pdVar28 = (data_ptr_t)((long)&local_d0.sel + 4);
                  }
                  local_d0.sel = (SelectionVector *)pVVar6;
                  local_d0.data = pdVar27;
                  uVar14 = (ulong)pVVar6 & 0xffffffff;
                  if (uVar14 != 0) {
                    uVar20 = 0;
                    do {
                      if ((char)pdVar28[uVar20] < '\0') {
                        uVar14 = Utf8Proc::GraphemeCount((char *)pdVar28,uVar14);
                        break;
                      }
                      uVar20 = uVar20 + 1;
                    } while (uVar14 != uVar20);
                  }
                  lVar17 = uVar14 + lVar17;
                  if (lVar17 < 1) {
                    lVar17 = 0;
                  }
                }
                sVar33.value.pointer.ptr = (char *)0x1;
                sVar33.value._0_8_ = pdVar27;
                sVar33 = SubstringGrapheme((duckdb *)result,pVVar6,sVar33,lVar17,in_R9);
                *(long *)(pdVar9 + lVar31) = sVar33.value._0_8_;
                *(long *)(pdVar9 + lVar31 + 8) = sVar33.value._8_8_;
                iVar32 = iVar32 + 1;
              } while (iVar32 != count);
            }
          }
          else if (0x3f < count + 0x3f) {
            local_88 = count + 0x3f >> 6;
            uVar20 = 0;
            uVar14 = 0;
            do {
              puVar4 = (local_d8->super_TemplatedValidityMask<unsigned_long>).validity_mask;
              if (puVar4 == (unsigned_long *)0x0) {
                uVar15 = 0xffffffffffffffff;
              }
              else {
                uVar15 = puVar4[uVar14];
              }
              uVar24 = uVar20 + 0x40;
              if (count <= uVar20 + 0x40) {
                uVar24 = count;
              }
              uVar23 = uVar24;
              if (uVar15 != 0) {
                uVar23 = uVar20;
                if (uVar15 == 0xffffffffffffffff) {
                  if (uVar20 < uVar24) {
                    do {
                      lVar31 = uVar20 * 0x10;
                      pVVar6 = *(Vector **)(pdVar7 + lVar31);
                      pdVar27 = *(data_ptr_t *)(pdVar7 + lVar31 + 8);
                      lVar17 = *(long *)(pdVar26 + uVar20 * 8);
                      if (lVar17 < 0) {
                        pdVar28 = pdVar27;
                        if (((ulong)pVVar6 & 0xffffffff) < 0xd) {
                          pdVar28 = (data_ptr_t)((long)&local_d0.sel + 4);
                        }
                        local_d0.sel = (SelectionVector *)pVVar6;
                        local_d0.data = pdVar27;
                        uVar15 = (ulong)pVVar6 & 0xffffffff;
                        if (uVar15 != 0) {
                          uVar23 = 0;
                          do {
                            if ((char)pdVar28[uVar23] < '\0') {
                              uVar15 = Utf8Proc::GraphemeCount((char *)pdVar28,uVar15);
                              break;
                            }
                            uVar23 = uVar23 + 1;
                          } while (uVar15 != uVar23);
                        }
                        lVar17 = uVar15 + lVar17;
                        if (lVar17 < 1) {
                          lVar17 = 0;
                        }
                      }
                      input_05.value.pointer.ptr = (char *)0x1;
                      input_05.value._0_8_ = pdVar27;
                      sVar33 = SubstringGrapheme((duckdb *)result,pVVar6,input_05,lVar17,in_R9);
                      *(long *)(pdVar9 + lVar31) = sVar33.value._0_8_;
                      *(long *)(pdVar9 + lVar31 + 8) = sVar33.value._8_8_;
                      uVar20 = uVar20 + 1;
                      uVar23 = uVar20;
                    } while (uVar20 != uVar24);
                  }
                }
                else if (uVar20 < uVar24) {
                  do {
                    if ((uVar15 >> ((ulong)(uint)((int)uVar23 - (int)uVar20) & 0x3f) & 1) != 0) {
                      lVar31 = uVar23 * 0x10;
                      pVVar6 = *(Vector **)(pdVar7 + lVar31);
                      pdVar27 = *(data_ptr_t *)(pdVar7 + lVar31 + 8);
                      lVar17 = *(long *)(pdVar26 + uVar23 * 8);
                      if (lVar17 < 0) {
                        pdVar28 = pdVar27;
                        if (((ulong)pVVar6 & 0xffffffff) < 0xd) {
                          pdVar28 = (data_ptr_t)((long)&local_d0.sel + 4);
                        }
                        local_d0.sel = (SelectionVector *)pVVar6;
                        local_d0.data = pdVar27;
                        uVar16 = (ulong)pVVar6 & 0xffffffff;
                        if (uVar16 != 0) {
                          uVar21 = 0;
                          do {
                            if ((char)pdVar28[uVar21] < '\0') {
                              uVar16 = Utf8Proc::GraphemeCount((char *)pdVar28,uVar16);
                              break;
                            }
                            uVar21 = uVar21 + 1;
                          } while (uVar16 != uVar21);
                        }
                        lVar17 = uVar16 + lVar17;
                        if (lVar17 < 1) {
                          lVar17 = 0;
                        }
                      }
                      input_06.value.pointer.ptr = (char *)0x1;
                      input_06.value._0_8_ = pdVar27;
                      sVar33 = SubstringGrapheme((duckdb *)result,pVVar6,input_06,lVar17,in_R9);
                      *(long *)(pdVar9 + lVar31) = sVar33.value._0_8_;
                      *(long *)(pdVar9 + lVar31 + 8) = sVar33.value._8_8_;
                    }
                    uVar23 = uVar23 + 1;
                  } while (uVar23 != uVar24);
                }
              }
              uVar20 = uVar23;
              uVar14 = uVar14 + 1;
            } while (uVar14 != local_88);
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_d0);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
          Vector::ToUnifiedFormat(vector,count,&local_d0);
          Vector::ToUnifiedFormat(vector_00,count,&local_78);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar7 = result->data;
          FlatVector::VerifyFlatVector(result);
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (count != 0) {
              lVar17 = *(long *)local_d0.sel;
              psVar10 = (local_78.sel)->sel_vector;
              iVar32 = 0;
              do {
                iVar18 = iVar32;
                if (lVar17 != 0) {
                  iVar18 = (idx_t)*(uint *)(lVar17 + iVar32 * 4);
                }
                iVar22 = iVar32;
                if (psVar10 != (sel_t *)0x0) {
                  iVar22 = (idx_t)psVar10[iVar32];
                }
                pVVar6 = *(Vector **)(local_d0.data + iVar18 * 0x10);
                p_Var11 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           (local_d0.data + iVar18 * 0x10 + 8);
                lVar31 = *(long *)(local_78.data + iVar22 * 8);
                if (lVar31 < 0) {
                  p_Var29 = p_Var11;
                  if (((ulong)pVVar6 & 0xffffffff) < 0xd) {
                    p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 4);
                  }
                  p_Stack_e0 = p_Var11;
                  uVar14 = (ulong)pVVar6 & 0xffffffff;
                  local_e8 = (undefined1  [8])pVVar6;
                  if (uVar14 != 0) {
                    uVar20 = 0;
                    do {
                      if (*(char *)((long)&p_Var29->_vptr__Sp_counted_base + uVar20) < '\0') {
                        uVar14 = Utf8Proc::GraphemeCount((char *)p_Var29,uVar14);
                        break;
                      }
                      uVar20 = uVar20 + 1;
                    } while (uVar14 != uVar20);
                  }
                  lVar31 = uVar14 + lVar31;
                  if (lVar31 < 1) {
                    lVar31 = 0;
                  }
                }
                input_01.value.pointer.ptr = (char *)0x1;
                input_01.value._0_8_ = p_Var11;
                sVar33 = SubstringGrapheme((duckdb *)result,pVVar6,input_01,lVar31,in_R9);
                *(long *)(pdVar7 + iVar32 * 0x10) = sVar33.value._0_8_;
                *(long *)(pdVar7 + iVar32 * 0x10 + 8) = sVar33.value._8_8_;
                iVar32 = iVar32 + 1;
              } while (iVar32 != count);
            }
          }
          else if (count != 0) {
            lVar17 = *(long *)local_d0.sel;
            psVar10 = (local_78.sel)->sel_vector;
            uVar14 = 0;
            do {
              uVar20 = uVar14;
              if (lVar17 != 0) {
                uVar20 = (ulong)*(uint *)(lVar17 + uVar14 * 4);
              }
              uVar15 = uVar14;
              if (psVar10 != (sel_t *)0x0) {
                uVar15 = (ulong)psVar10[uVar14];
              }
              if (((local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0)) &&
                 ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar15 >> 6] >> (uVar15 & 0x3f) & 1) != 0)))) {
                pVVar6 = *(Vector **)(local_d0.data + uVar20 * 0x10);
                p_Var11 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                           (local_d0.data + uVar20 * 0x10 + 8);
                lVar31 = *(long *)(local_78.data + uVar15 * 8);
                if (lVar31 < 0) {
                  p_Var29 = p_Var11;
                  if (((ulong)pVVar6 & 0xffffffff) < 0xd) {
                    p_Var29 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 4);
                  }
                  p_Stack_e0 = p_Var11;
                  uVar20 = (ulong)pVVar6 & 0xffffffff;
                  local_e8 = (undefined1  [8])pVVar6;
                  if (uVar20 != 0) {
                    uVar15 = 0;
                    do {
                      if (*(char *)((long)&p_Var29->_vptr__Sp_counted_base + uVar15) < '\0') {
                        uVar20 = Utf8Proc::GraphemeCount((char *)p_Var29,uVar20);
                        break;
                      }
                      uVar15 = uVar15 + 1;
                    } while (uVar20 != uVar15);
                  }
                  lVar31 = uVar20 + lVar31;
                  if (lVar31 < 1) {
                    lVar31 = 0;
                  }
                }
                input_07.value.pointer.ptr = (char *)0x1;
                input_07.value._0_8_ = p_Var11;
                sVar33 = SubstringGrapheme((duckdb *)result,pVVar6,input_07,lVar31,in_R9);
                *(long *)(pdVar7 + uVar14 * 0x10) = sVar33.value._0_8_;
                *(long *)(pdVar7 + uVar14 * 0x10 + 8) = sVar33.value._8_8_;
              }
              else {
                if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) {
                  local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)local_e8,&local_80);
                  p_Var29 = p_Stack_e0;
                  auVar13 = local_e8;
                  local_e8 = (undefined1  [8])0x0;
                  p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var11 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data.internal.
                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)auVar13;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var29;
                  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
                  }
                  if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
                  }
                  pTVar19 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                       (unsigned_long *)
                       (pTVar19->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar12 = (byte)uVar14 & 0x3f;
                puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                         + (uVar14 >> 6);
                *puVar1 = *puVar1 & (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 != count);
          }
          if (local_78.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_d0.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        return;
      }
      pdVar7 = vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar26 = vector_00->data;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar9 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask !=
            (unsigned_long *)0x0) {
          if (count + 0x3f < 0x40) {
            return;
          }
          uVar20 = 0;
          uVar14 = 0;
          do {
            puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar4 == (unsigned_long *)0x0) {
              uVar15 = 0xffffffffffffffff;
            }
            else {
              uVar15 = puVar4[uVar14];
            }
            uVar24 = uVar20 + 0x40;
            if (count <= uVar20 + 0x40) {
              uVar24 = count;
            }
            uVar23 = uVar24;
            if (uVar15 != 0) {
              uVar23 = uVar20;
              if (uVar15 == 0xffffffffffffffff) {
                if (uVar20 < uVar24) {
                  pVVar6 = *(Vector **)pdVar7;
                  pdVar27 = *(data_ptr_t *)(pdVar7 + 8);
                  do {
                    lVar17 = *(long *)(pdVar26 + uVar20 * 8);
                    if (lVar17 < 0) {
                      pdVar28 = pdVar27;
                      if (((ulong)pVVar6 & 0xffffffff) < 0xd) {
                        pdVar28 = (data_ptr_t)((long)&local_d0.sel + 4);
                      }
                      local_d0.sel = (SelectionVector *)pVVar6;
                      local_d0.data = pdVar27;
                      uVar15 = (ulong)pVVar6 & 0xffffffff;
                      if (uVar15 != 0) {
                        uVar23 = 0;
                        do {
                          if ((char)pdVar28[uVar23] < '\0') {
                            uVar15 = Utf8Proc::GraphemeCount((char *)pdVar28,uVar15);
                            break;
                          }
                          uVar23 = uVar23 + 1;
                        } while (uVar15 != uVar23);
                      }
                      lVar17 = uVar15 + lVar17;
                      if (lVar17 < 1) {
                        lVar17 = 0;
                      }
                    }
                    input_02.value.pointer.ptr = (char *)0x1;
                    input_02.value._0_8_ = pdVar27;
                    sVar33 = SubstringGrapheme((duckdb *)result,pVVar6,input_02,lVar17,in_R9);
                    *(long *)(pdVar9 + uVar20 * 0x10) = sVar33.value._0_8_;
                    *(long *)(pdVar9 + uVar20 * 0x10 + 8) = sVar33.value._8_8_;
                    uVar20 = uVar20 + 1;
                    uVar23 = uVar20;
                  } while (uVar20 != uVar24);
                }
              }
              else if (uVar20 < uVar24) {
                do {
                  if ((uVar15 >> ((ulong)(uint)((int)uVar23 - (int)uVar20) & 0x3f) & 1) != 0) {
                    pVVar6 = *(Vector **)pdVar7;
                    pdVar27 = *(data_ptr_t *)(pdVar7 + 8);
                    lVar17 = *(long *)(pdVar26 + uVar23 * 8);
                    if (lVar17 < 0) {
                      pdVar28 = pdVar27;
                      if (((ulong)pVVar6 & 0xffffffff) < 0xd) {
                        pdVar28 = (data_ptr_t)((long)&local_d0.sel + 4);
                      }
                      local_d0.sel = (SelectionVector *)pVVar6;
                      local_d0.data = pdVar27;
                      uVar16 = (ulong)pVVar6 & 0xffffffff;
                      if (uVar16 != 0) {
                        uVar21 = 0;
                        do {
                          if ((char)pdVar28[uVar21] < '\0') {
                            uVar16 = Utf8Proc::GraphemeCount((char *)pdVar28,uVar16);
                            break;
                          }
                          uVar21 = uVar21 + 1;
                        } while (uVar16 != uVar21);
                      }
                      lVar17 = uVar16 + lVar17;
                      if (lVar17 < 1) {
                        lVar17 = 0;
                      }
                    }
                    input_03.value.pointer.ptr = (char *)0x1;
                    input_03.value._0_8_ = pdVar27;
                    sVar33 = SubstringGrapheme((duckdb *)result,pVVar6,input_03,lVar17,in_R9);
                    *(long *)(pdVar9 + uVar23 * 0x10) = sVar33.value._0_8_;
                    *(long *)(pdVar9 + uVar23 * 0x10 + 8) = sVar33.value._8_8_;
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar23 != uVar24);
              }
            }
            uVar20 = uVar23;
            uVar14 = uVar14 + 1;
            if (uVar14 == count + 0x3f >> 6) {
              return;
            }
          } while( true );
        }
        if (count == 0) {
          return;
        }
        pVVar6 = *(Vector **)pdVar7;
        pdVar7 = *(data_ptr_t *)(pdVar7 + 8);
        iVar32 = 0;
        do {
          lVar17 = *(long *)(pdVar26 + iVar32 * 8);
          lVar31 = lVar17;
          if (lVar17 < 0) {
            pdVar27 = pdVar7;
            if (((ulong)pVVar6 & 0xffffffff) < 0xd) {
              pdVar27 = (data_ptr_t)((long)&local_d0.sel + 4);
            }
            local_d0.sel = (SelectionVector *)pVVar6;
            local_d0.data = pdVar7;
            uVar14 = (ulong)pVVar6 & 0xffffffff;
            if (uVar14 != 0) {
              uVar20 = 0;
              do {
                if ((char)pdVar27[uVar20] < '\0') {
                  uVar14 = Utf8Proc::GraphemeCount((char *)pdVar27,uVar14);
                  break;
                }
                uVar20 = uVar20 + 1;
              } while (uVar14 != uVar20);
            }
            lVar31 = uVar14 + lVar17;
            if ((long)(uVar14 + lVar17) < 1) {
              lVar31 = 0;
            }
          }
          input_08.value.pointer.ptr = (char *)0x1;
          input_08.value._0_8_ = pdVar7;
          sVar33 = SubstringGrapheme((duckdb *)result,pVVar6,input_08,lVar31,in_R9);
          *(long *)(pdVar9 + iVar32 * 0x10) = sVar33.value._0_8_;
          *(long *)(pdVar9 + iVar32 * 0x10 + 8) = sVar33.value._8_8_;
          iVar32 = iVar32 + 1;
          if (iVar32 == count) {
            return;
          }
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void LeftFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &str_vec = args.data[0];
	auto &pos_vec = args.data[1];

	BinaryExecutor::Execute<string_t, int64_t, string_t>(
	    str_vec, pos_vec, result, args.size(),
	    [&](string_t str, int64_t pos) { return LeftScalarFunction<OP>(result, str, pos); });
}